

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  size_t min;
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  void *pvVar4;
  void *pvVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  char *fmt;
  long lVar10;
  uchar props [5];
  ssize_t avail_in;
  lzma_filter filters [2];
  ssize_t avail_in_1;
  undefined1 local_6d;
  int local_6c;
  long local_68;
  void **local_60;
  ssize_t local_58 [5];
  
  puVar1 = (undefined8 *)self->data;
  pvVar5 = (void *)puVar1[0x11];
  puVar1[3] = pvVar5;
  puVar1[4] = puVar1[0x12];
  pvVar4 = pvVar5;
  if (puVar1[0x12] != 0) {
    local_60 = p;
    do {
      if (*(char *)(puVar1 + 0x14) != '\0') break;
      if (*(char *)((long)puVar1 + 0xa1) == '\0') {
        pvVar5 = self->data;
        pvVar4 = __archive_read_filter_ahead(self->upstream,6,local_58 + 4);
        if (pvVar4 == (void *)0x0) {
          return -0x1e;
        }
        *(undefined1 *)((long)pvVar5 + 0xa2) = *(undefined1 *)((long)pvVar4 + 4);
        local_6d = 0x5d;
        uVar7 = *(byte *)((long)pvVar4 + 5) & 0x1f;
        if (uVar7 - 0x1c < 0xfffffff0) {
          return -0x1e;
        }
        uVar8 = 1 << (sbyte)uVar7;
        local_6c = (uint)(*(byte *)((long)pvVar4 + 5) >> 5) * (uVar8 >> 4);
        if (uVar7 < 0xd) {
          local_6c = 0;
        }
        local_6c = uVar8 - local_6c;
        __archive_read_filter_consume(self->upstream,6);
        *(undefined8 *)((long)pvVar5 + 0xa8) = 6;
        local_58[0] = 0x4000000000000001;
        local_58[1] = 0;
        local_58[2] = 0xffffffffffffffff;
        local_58[3] = 0;
        iVar2 = lzma_properties_decode(local_58,0,&local_6d,5);
        if ((iVar2 != 0) || (iVar2 = lzma_raw_decoder(pvVar5,local_58), iVar2 != 0))
        goto LAB_0011ceba;
        *(undefined1 *)((long)puVar1 + 0xa1) = 1;
      }
      pvVar5 = __archive_read_filter_ahead(self->upstream,1,&local_68);
      *puVar1 = pvVar5;
      if (local_68 < 0 && pvVar5 == (void *)0x0) {
        archive_set_error(&self->archive->archive,-1,"truncated input");
        return -0x1e;
      }
      puVar1[1] = local_68;
      iVar2 = lzma_code(puVar1,(local_68 == 0) * '\x03');
      if (iVar2 != 0) {
        if (iVar2 != 1) {
LAB_0011ceba:
          set_error(self,iVar2);
          return -0x1e;
        }
        *(undefined1 *)(puVar1 + 0x14) = 1;
      }
      __archive_read_filter_consume(self->upstream,local_68 - puVar1[1]);
      puVar1[0x15] = puVar1[0x15] + (local_68 - puVar1[1]);
    } while (puVar1[4] != 0);
    pvVar4 = (void *)puVar1[3];
    pvVar5 = (void *)puVar1[0x11];
    p = local_60;
  }
  lVar10 = (long)pvVar4 - (long)pvVar5;
  puVar1[0x13] = puVar1[0x13] + lVar10;
  puVar1[0x16] = puVar1[0x16] + lVar10;
  if (lVar10 == 0) {
    *p = (void *)0x0;
    lVar9 = 0;
  }
  else {
    *p = pvVar5;
    lVar9 = lVar10;
    if (self->code == 9) {
      uVar3 = lzma_crc32(puVar1[0x11],lVar10,*(undefined4 *)((long)puVar1 + 0xa4));
      *(undefined4 *)((long)puVar1 + 0xa4) = uVar3;
      if (*(char *)(puVar1 + 0x14) != '\0') {
        pvVar5 = self->data;
        min = (ulong)(*(char *)((long)pvVar5 + 0xa2) != '\0') * 8 + 0xc;
        piVar6 = (int *)__archive_read_filter_ahead(self->upstream,min,local_58);
        lVar9 = -0x1e;
        if (piVar6 != (int *)0x0 || -1 < local_58[0]) {
          if (local_58[0] < (long)min) {
            fmt = "Lzip: Remaining data is less bytes";
          }
          else if (*(int *)((long)pvVar5 + 0xa4) == *piVar6) {
            if (*(long *)((long)pvVar5 + 0xb0) == *(long *)(piVar6 + 1)) {
              if ((*(char *)((long)pvVar5 + 0xa2) != '\x01') ||
                 (*(long *)((long)pvVar5 + 0xa8) + min == *(long *)(piVar6 + 3))) {
                __archive_read_filter_consume(self->upstream,min);
                iVar2 = lzip_has_member(self->upstream);
                if (iVar2 != 0) {
                  *(undefined2 *)((long)pvVar5 + 0xa0) = 0;
                  *(undefined8 *)((long)pvVar5 + 0xa4) = 0;
                  *(undefined8 *)((long)pvVar5 + 0xac) = 0;
                  *(undefined4 *)((long)pvVar5 + 0xb4) = 0;
                  return lVar10;
                }
                return lVar10;
              }
              fmt = "Lzip: Member size error";
            }
            else {
              fmt = "Lzip: Uncompressed size error";
            }
          }
          else {
            fmt = "Lzip: CRC32 error";
          }
          archive_set_error(&self->archive->archive,-1,fmt);
          lVar9 = -0x19;
        }
      }
    }
  }
  return lVar9;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}